

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Btree_BtreeMapCanHoldMoveOnlyTypes_Test::
~Btree_BtreeMapCanHoldMoveOnlyTypes_Test(Btree_BtreeMapCanHoldMoveOnlyTypes_Test *this)

{
  Btree_BtreeMapCanHoldMoveOnlyTypes_Test *this_local;
  
  ~Btree_BtreeMapCanHoldMoveOnlyTypes_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, BtreeMapCanHoldMoveOnlyTypes) {
        phmap::btree_map<std::string, std::unique_ptr<std::string>> m;

        std::unique_ptr<std::string> &v = m["A"];
        EXPECT_TRUE(v == nullptr);
        v.reset(new std::string("X"));

        auto iter = m.find("A");
        EXPECT_EQ("X", *iter->second);
    }